

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

string * __thiscall
cmOutputConverter::MaybeRelativeTo
          (string *__return_storage_ptr__,cmOutputConverter *this,string *param_1,
          string *remote_path)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  
  bVar1 = anon_unknown.dwarf_80921e::PathEqOrSubDir(param_1,&this->RelativePathTopBinary);
  bVar2 = anon_unknown.dwarf_80921e::PathEqOrSubDir(remote_path,&this->RelativePathTopBinary);
  bVar3 = anon_unknown.dwarf_80921e::PathEqOrSubDir(param_1,&this->RelativePathTopSource);
  bVar4 = anon_unknown.dwarf_80921e::PathEqOrSubDir(remote_path,&this->RelativePathTopSource);
  if (this->RelativePathTopRelation == SrcInBin) {
    bVar1 = bVar1 && !bVar3;
    bVar2 = bVar2 && !bVar4;
  }
  else if (this->RelativePathTopRelation == BinInSrc) {
    bVar3 = bVar3 && !bVar1;
    bVar4 = bVar4 && !bVar2;
  }
  if (((bVar3 & bVar4) == 0) && ((bVar2 & bVar1) == 0)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)remote_path);
  }
  else {
    cmSystemTools::ForceToRelativePath(__return_storage_ptr__,param_1,remote_path);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::MaybeRelativeTo(
  std::string const& local_path, std::string const& remote_path) const
{
  bool localInBinary = PathEqOrSubDir(local_path, this->RelativePathTopBinary);
  bool remoteInBinary =
    PathEqOrSubDir(remote_path, this->RelativePathTopBinary);

  bool localInSource = PathEqOrSubDir(local_path, this->RelativePathTopSource);
  bool remoteInSource =
    PathEqOrSubDir(remote_path, this->RelativePathTopSource);

  switch (this->RelativePathTopRelation) {
    case TopRelation::Separate:
      // Checks are independent.
      break;
    case TopRelation::BinInSrc:
      localInSource = localInSource && !localInBinary;
      remoteInSource = remoteInSource && !remoteInBinary;
      break;
    case TopRelation::SrcInBin:
      localInBinary = localInBinary && !localInSource;
      remoteInBinary = remoteInBinary && !remoteInSource;
      break;
    case TopRelation::InSource:
      // Checks are identical.
      break;
  };

  bool const bothInBinary = localInBinary && remoteInBinary;
  bool const bothInSource = localInSource && remoteInSource;

  if (bothInBinary || bothInSource) {
    return cmSystemTools::ForceToRelativePath(local_path, remote_path);
  }
  return remote_path;
}